

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointBelief.cpp
# Opt level: O0

double __thiscall
JointBelief::Update(JointBelief *this,MultiAgentDecisionProcessDiscreteInterface *pu,Index lastJAI,
                   Index newJOI)

{
  byte bVar1;
  ulong uVar2;
  long *plVar3;
  reference pvVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long *in_RSI;
  long *in_RDI;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Index sI_2;
  double Po_sas_1;
  Index prec_sI_3;
  Index prec_sI_2;
  double Ps_ba_1;
  double Po_as_1;
  double Pso_ba_1;
  Index sI_1;
  double Po_sas;
  Index prec_sI_1;
  Index prec_sI;
  double Ps_ba;
  double Po_as;
  double Pso_ba;
  Index sI;
  TGet *T;
  size_t nrS;
  vector<double,_std::allocator<double>_> newJB_unnorm;
  double Po_ba;
  value_type_conflict3 *in_stack_fffffffffffffea8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb0;
  uint local_bc;
  uint local_b0;
  uint local_ac;
  double local_a8;
  double local_98;
  uint local_8c;
  uint local_80;
  uint local_7c;
  double local_78;
  double local_68;
  uint local_5c;
  vector<double,_std::allocator<double>_> local_38;
  double local_20;
  undefined4 local_18;
  undefined4 local_14;
  long *local_10;
  
  local_20 = 0.0;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x9bb05e);
  uVar2 = (**(code **)(*local_10 + 0x30))();
  plVar3 = (long *)(**(code **)(*local_10 + 0x110))();
  if (plVar3 == (long *)0x0) {
    for (local_8c = 0; local_8c < uVar2; local_8c = local_8c + 1) {
      local_98 = 0.0;
      bVar1 = (**(code **)(*local_10 + 0x140))();
      if ((bVar1 & 1) == 0) {
        local_98 = (double)(**(code **)(*local_10 + 0x118))(local_10,local_14,local_8c,local_18);
        local_a8 = 0.0;
        for (local_ac = 0; local_ac < uVar2; local_ac = local_ac + 1) {
          uVar5 = (**(code **)(*local_10 + 0x108))(local_10,local_ac,local_14,local_8c);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              ((long)in_RDI + *(long *)(*in_RDI + -0xd8) + 0x10),(ulong)local_ac);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar5;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *pvVar4;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_a8;
          auVar11 = vfmadd213sd_fma(auVar10,auVar14,auVar18);
          local_a8 = auVar11._0_8_;
        }
        local_98 = local_98 * local_a8;
      }
      else {
        for (local_b0 = 0; local_b0 < uVar2; local_b0 = local_b0 + 1) {
          dVar6 = (double)(**(code **)(*local_10 + 0x120))
                                    (local_10,local_b0,local_14,local_8c,local_18);
          dVar7 = (double)(**(code **)(*local_10 + 0x108))(local_10,local_b0,local_14,local_8c);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              ((long)in_RDI + *(long *)(*in_RDI + -0xd8) + 0x10),(ulong)local_b0);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = dVar6 * dVar7;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *pvVar4;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_98;
          auVar11 = vfmadd213sd_fma(auVar11,auVar15,auVar19);
          local_98 = auVar11._0_8_;
        }
      }
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      local_20 = local_98 + local_20;
    }
  }
  else {
    for (local_5c = 0; local_5c < uVar2; local_5c = local_5c + 1) {
      local_68 = 0.0;
      bVar1 = (**(code **)(*local_10 + 0x140))();
      if ((bVar1 & 1) == 0) {
        local_68 = (double)(**(code **)(*local_10 + 0x118))(local_10,local_14,local_5c,local_18);
        local_78 = 0.0;
        for (local_7c = 0; local_7c < uVar2; local_7c = local_7c + 1) {
          uVar5 = (**(code **)(*plVar3 + 0x10))(plVar3,local_7c,local_14,local_5c);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              ((long)in_RDI + *(long *)(*in_RDI + -0xd8) + 0x10),(ulong)local_7c);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar5;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *pvVar4;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_78;
          auVar11 = vfmadd213sd_fma(auVar8,auVar12,auVar16);
          local_78 = auVar11._0_8_;
        }
        local_68 = local_68 * local_78;
      }
      else {
        for (local_80 = 0; local_80 < uVar2; local_80 = local_80 + 1) {
          dVar6 = (double)(**(code **)(*local_10 + 0x120))
                                    (local_10,local_80,local_14,local_5c,local_18);
          dVar7 = (double)(**(code **)(*plVar3 + 0x10))(plVar3,local_80,local_14,local_5c);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              ((long)in_RDI + *(long *)(*in_RDI + -0xd8) + 0x10),(ulong)local_80);
          auVar13._8_8_ = 0;
          auVar13._0_8_ = dVar6 * dVar7;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *pvVar4;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_68;
          auVar11 = vfmadd213sd_fma(auVar9,auVar13,auVar17);
          local_68 = auVar11._0_8_;
        }
      }
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      local_20 = local_68 + local_20;
    }
  }
  if (0.0 < local_20) {
    for (local_bc = 0; local_bc < uVar2; local_bc = local_bc + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(ulong)local_bc);
      in_stack_fffffffffffffeb0 = (vector<double,_std::allocator<double>_> *)(*pvVar4 / local_20);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)in_RDI + *(long *)(*in_RDI + -0xd8) + 0x10),(ulong)local_bc);
      *pvVar4 = (value_type)in_stack_fffffffffffffeb0;
    }
  }
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))();
  }
  dVar6 = local_20;
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffeb0);
  return dVar6;
}

Assistant:

double JointBelief::Update(const MultiAgentDecisionProcessDiscreteInterface &pu,
                           Index lastJAI, Index newJOI)
{
    double Po_ba = 0.0; // P(o|b,a) with o=newJO
    vector<double> newJB_unnorm;
    size_t nrS = pu.GetNrStates();
    
    TGet* T = 0;
    T = pu.GetTGet();
    if(T != 0)
    {
        for(Index sI=0; sI < nrS; sI++)
        {
            double Pso_ba = 0.0;
            if(!pu.GetEventObservability())
            {
                //P(newJOI | lastJAI, sI) :
                double Po_as = pu.GetObservationProbability(lastJAI, sI, newJOI);
                //P(sI | b, a) = sum_(prec_s) P(sI | prec_s, a)*JB(prec_s)
                double Ps_ba = 0.0;
                //for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                //Ps_ba += T->Get(it.index(), lastJAI, sI) * *it;
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                    Ps_ba += T->Get(prec_sI, lastJAI, sI) * _m_b[prec_sI];
                //Ps_ba += pu.GetTransitionProbability(prec_sI, lastJAI, sI) * 
                //_m_b[prec_sI];

                //the new (unormalized) belief P(s,o|b,a)
                Pso_ba = Po_as * Ps_ba;
            }
            else
            {
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                {
                    //P(newJOI | prec_sI, lastJAI, sI) :
                    double Po_sas = pu.GetObservationProbability(prec_sI, lastJAI, sI, newJOI);
                    //P(sI, newJOI | b, a) = sum_(prec_s) P(newJOI | prec_sI, lastJAI, sI)*P(sI | prec_s, a)* JB(prec_s)
                    Pso_ba += Po_sas * T->Get(prec_sI, lastJAI, sI) * _m_b[prec_sI];
                }
            }
            newJB_unnorm.push_back(Pso_ba); //unormalized new belief
            Po_ba += Pso_ba; //running sum of P(o|b,a)
        }
    }
    else 
    {
        for(Index sI=0; sI < nrS; sI++)
        {
            double Pso_ba = 0.0;
            if(!pu.GetEventObservability())
            {
                //P(newJOI | lastJAI, sI) :
                double Po_as = pu.GetObservationProbability(lastJAI, sI, newJOI);
                //P(sI | b, a) = sum_(prec_s) P(sI | prec_s, a)*JB(prec_s)
                double Ps_ba = 0.0;
                //for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                //Ps_ba += T->Get(it.index(), lastJAI, sI) * *it;
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                  Ps_ba += pu.GetTransitionProbability(prec_sI, lastJAI, sI) * 
                    _m_b[prec_sI];
                
                //the new (unormalized) belief P(s,o|b,a)
                Pso_ba = Po_as * Ps_ba;
            }
            else
            {
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                {
                    //P(newJOI | prec_sI, lastJAI, sI) :
                    double Po_sas = pu.GetObservationProbability(prec_sI, lastJAI, sI, newJOI);
                    //P(sI, newJOI | b, a) = sum_(prec_s) P(newJOI | prec_sI, lastJAI, sI)*P(sI | prec_s, a)* JB(prec_s)
                    Pso_ba += Po_sas * pu.GetTransitionProbability(prec_sI, lastJAI, sI) * _m_b[prec_sI];
                }
            }                
            newJB_unnorm.push_back(Pso_ba); //unormalized new belief
            Po_ba += Pso_ba; //running sum of P(o|b,a)
        }
        //throw E("JointBelief::Update tried to obtain a TGet, but apparently the transition model is not cached? (it should be, since this belief update loops over all states it should be possible to cache the transition model)");
    }
   
    //normalize:
    if(Po_ba>0)
        for(Index sI=0; sI < nrS; sI++)
            _m_b[sI]=newJB_unnorm[sI]/Po_ba;

    delete T;

#if JointBelief_doSanityCheckAfterEveryUpdate
    if(!SanityCheck())
        throw(E("JointBelief::Update SanityCheck failed"));
#endif

    return(Po_ba);
}